

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlNodeIsConst(Aig_Obj_t *pObj)

{
  void *pvVar1;
  uint *puVar2;
  int local_2c;
  int i;
  uint *pSims;
  Fra_Man_t *p;
  Aig_Obj_t *pObj_local;
  
  pvVar1 = (pObj->field_5).pData;
  puVar2 = Fra_ObjSim(*(Fra_Sml_t **)((long)pvVar1 + 0x38),pObj->Id);
  local_2c = *(int *)(*(long *)((long)pvVar1 + 0x38) + 0x18);
  while( true ) {
    if (*(int *)(*(long *)((long)pvVar1 + 0x38) + 0x14) <= local_2c) {
      return 1;
    }
    if (puVar2[local_2c] != 0) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Fra_SmlNodeIsConst( Aig_Obj_t * pObj )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj->pData;
    unsigned * pSims;
    int i;
    pSims = Fra_ObjSim(p->pSml, pObj->Id);
    for ( i = p->pSml->nWordsPref; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            return 0;
    return 1;
}